

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,istream *is,NameSet *rowNames,NameSet *colNames)

{
  pointer pnVar1;
  NameSet *pNVar2;
  bool bVar3;
  Status SVar4;
  int iVar5;
  uint uVar6;
  uint i;
  Type TVar7;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  char cVar9;
  ulong uVar10;
  long lVar11;
  pointer pnVar12;
  long lVar13;
  long in_FS_OFFSET;
  NameSet *p_rowNames;
  NameSet *p_colNames;
  DataKey key;
  stringstream name;
  NameSet *local_4b8;
  NameSet *local_4b0;
  DataKey local_4a8;
  NameSet *local_4a0;
  NameSet *local_498;
  Desc local_490;
  NameSet *local_450;
  NameSet *local_448;
  istream *local_440;
  cpp_dec_float<200U,_int,_void> local_438;
  undefined4 local_3b8;
  uint uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  double local_3a8;
  undefined8 uStack_3a0;
  undefined1 local_398 [16];
  istream *local_388;
  undefined8 uStack_380;
  ulong local_378;
  char acStack_370 [80];
  fpclass_type local_320 [2];
  ios_base local_318 [168];
  char *local_270;
  char *pcStack_268;
  char *local_260;
  char *pcStack_258;
  char *local_250;
  char *pcStack_248;
  char local_240;
  char local_140;
  undefined2 local_40;
  int local_3c;
  
  local_4b0 = (NameSet *)0x0;
  local_4b8 = (NameSet *)0x0;
  local_4a0 = colNames;
  local_498 = rowNames;
  local_448 = colNames;
  local_440 = is;
  if (colNames == (NameSet *)0x0) {
    uVar6 = (this->theLP->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_398);
    spx_alloc<soplex::NameSet*>(&local_4b0,1);
    pNVar2 = local_4b0;
    NameSet::NameSet(local_4b0,10000,-1,2.0,2.0);
    local_4b0 = pNVar2;
    NameSet::reMax(pNVar2,uVar6);
    if (0 < (int)uVar6) {
      uVar10 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_388,"x",1);
        std::ostream::operator<<((ostream *)&local_388,(int)uVar10);
        local_490.rowstat._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[uVar10];
        SPxColId::SPxColId((SPxColId *)&local_438,(DataKey *)&local_490);
        pNVar2 = local_4b0;
        local_4a8.info = local_438.data._M_elems[0];
        local_4a8.idx = local_438.data._M_elems[1];
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar2,&local_4a8,(char *)local_438.data._M_elems._0_8_);
        rowNames = local_498;
        if (local_438.data._M_elems._0_8_ != (long)&local_438 + 0x10U) {
          operator_delete((void *)local_438.data._M_elems._0_8_,local_438.data._M_elems._16_8_ + 1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    local_4a0 = local_4b0;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
    std::ios_base::~ios_base(local_318);
  }
  if (rowNames == (NameSet *)0x0) {
    uVar6 = (this->theLP->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    std::__cxx11::stringstream::stringstream((stringstream *)local_398);
    spx_alloc<soplex::NameSet*>(&local_4b8,1);
    pNVar2 = local_4b8;
    NameSet::NameSet(local_4b8,10000,-1,2.0,2.0);
    local_4b8 = pNVar2;
    NameSet::reMax(pNVar2,uVar6);
    if (0 < (int)uVar6) {
      uVar10 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_388,"C",1);
        std::ostream::operator<<((ostream *)&local_388,(int)uVar10);
        local_490.rowstat._0_8_ =
             (this->theLP->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[uVar10];
        SPxRowId::SPxRowId((SPxRowId *)&local_438,(DataKey *)&local_490);
        pNVar2 = local_4b8;
        local_4a8.info = local_438.data._M_elems[0];
        local_4a8.idx = local_438.data._M_elems[1];
        std::__cxx11::stringbuf::str();
        NameSet::add(pNVar2,&local_4a8,(char *)local_438.data._M_elems._0_8_);
        if (local_438.data._M_elems._0_8_ != (long)&local_438 + 0x10U) {
          operator_delete((void *)local_438.data._M_elems._0_8_,local_438.data._M_elems._16_8_ + 1);
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
    }
    rowNames = local_4b8;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_398);
    std::ios_base::~ios_base(local_318);
  }
  if (this->thestatus == NO_PROBLEM) {
    (*this->_vptr_SPxBasisBase[7])(this,this->theLP,0);
  }
  Desc::Desc(&local_490,&this->thedesc);
  pSVar8 = this->theLP;
  if (0 < (pSVar8->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar11 = 0;
    do {
      SVar4 = dualRowStatus(this,(int)lVar11);
      local_490.rowstat.data[lVar11] = SVar4;
      lVar11 = lVar11 + 1;
      pSVar8 = this->theLP;
    } while (lVar11 < (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_450 = rowNames;
  if (0 < (pSVar8->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_3a8 = *(double *)(in_FS_OFFSET + -8);
    local_3b8 = SUB84(local_3a8,0);
    uStack_3a0 = 0;
    uStack_3b4 = (uint)((ulong)local_3a8 >> 0x20) ^ 0x80000000;
    uStack_3b0 = 0;
    uStack_3ac = 0x80000000;
    lVar13 = 0;
    lVar11 = 0;
    do {
      pnVar12 = (pSVar8->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar13 + 8U) == 2) ||
         (pnVar1 = (pSVar8->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)(&(pnVar1->m_backend).data + 1) + lVar13 + 8U) == 2)) {
LAB_004f20b6:
        ::soplex::infinity::__tls_init();
        local_320 = (fpclass_type  [2])0x1c00000000;
        local_398._0_8_ = (_func_int **)0x0;
        local_398._8_8_ = 0;
        local_388 = (istream *)0x0;
        uStack_380._0_4_ = 0;
        uStack_380._4_4_ = ~MINIMIZE;
        local_378 = 0;
        acStack_370[0] = '\0';
        acStack_370[1] = '\0';
        acStack_370[2] = '\0';
        acStack_370[3] = '\0';
        acStack_370[4] = '\0';
        acStack_370[5] = '\0';
        acStack_370[6] = '\0';
        acStack_370[7] = '\0';
        acStack_370[8] = '\0';
        acStack_370[9] = '\0';
        acStack_370[10] = '\0';
        acStack_370[0xb] = '\0';
        acStack_370[0xc] = '\0';
        acStack_370[0xd] = '\0';
        acStack_370[0xe] = '\0';
        acStack_370[0xf] = '\0';
        acStack_370[0x10] = '\0';
        acStack_370[0x11] = '\0';
        acStack_370[0x12] = '\0';
        acStack_370[0x13] = '\0';
        acStack_370[0x14] = '\0';
        acStack_370[0x15] = '\0';
        acStack_370[0x16] = '\0';
        acStack_370[0x17] = '\0';
        acStack_370[0x18] = '\0';
        acStack_370[0x19] = '\0';
        acStack_370[0x1a] = '\0';
        acStack_370[0x1b] = '\0';
        acStack_370[0x1c] = '\0';
        acStack_370[0x1d] = '\0';
        acStack_370[0x1e] = '\0';
        acStack_370[0x1f] = '\0';
        acStack_370[0x20] = '\0';
        acStack_370[0x21] = '\0';
        acStack_370[0x22] = '\0';
        acStack_370[0x23] = '\0';
        acStack_370[0x24] = '\0';
        acStack_370[0x25] = '\0';
        acStack_370[0x26] = '\0';
        acStack_370[0x27] = '\0';
        acStack_370[0x28] = '\0';
        acStack_370[0x29] = '\0';
        acStack_370[0x2a] = '\0';
        acStack_370[0x2b] = '\0';
        acStack_370[0x2c] = '\0';
        acStack_370[0x2d] = '\0';
        acStack_370[0x2e] = '\0';
        acStack_370[0x2f] = '\0';
        acStack_370[0x30] = '\0';
        acStack_370[0x31] = '\0';
        acStack_370[0x32] = '\0';
        acStack_370[0x33] = '\0';
        acStack_370[0x34] = '\0';
        acStack_370[0x35] = '\0';
        acStack_370[0x36] = '\0';
        acStack_370[0x37] = '\0';
        acStack_370[0x38] = '\0';
        acStack_370[0x39] = '\0';
        acStack_370[0x3a] = '\0';
        acStack_370[0x3b] = '\0';
        acStack_370[0x3c] = '\0';
        acStack_370[0x3d] = '\0';
        acStack_370[0x3e] = '\0';
        acStack_370[0x3f] = '\0';
        acStack_370[0x40] = '\0';
        acStack_370[0x41] = '\0';
        acStack_370[0x42] = '\0';
        acStack_370[0x43] = '\0';
        acStack_370[0x44] = '\0';
        acStack_370[0x45] = '\0';
        acStack_370[0x46] = '\0';
        acStack_370[0x47] = '\0';
        acStack_370[0x48] = '\0';
        acStack_370[0x49] = '\0';
        acStack_370[0x4a] = '\0';
        acStack_370[0x4b] = '\0';
        acStack_370[0x4c] = '\0';
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_398,(double)CONCAT44(uStack_3b4,local_3b8))
        ;
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar13 + 8U) != 2) &&
            (local_320[0] != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar13),
                               (cpp_dec_float<200U,_int,_void> *)local_398), iVar5 < 1)) {
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_438.fpclass = cpp_dec_float_finite;
          local_438.prec_elem = 0x1c;
          local_438.data._M_elems[0] = 0;
          local_438.data._M_elems[1] = 0;
          local_438.data._M_elems[2] = 0;
          local_438.data._M_elems[3] = 0;
          local_438.data._M_elems[4] = 0;
          local_438.data._M_elems[5] = 0;
          local_438.data._M_elems[6] = 0;
          local_438.data._M_elems[7] = 0;
          local_438.data._M_elems[8] = 0;
          local_438.data._M_elems[9] = 0;
          local_438.data._M_elems[10] = 0;
          local_438.data._M_elems[0xb] = 0;
          local_438.data._M_elems[0xc] = 0;
          local_438.data._M_elems[0xd] = 0;
          local_438.data._M_elems[0xe] = 0;
          local_438.data._M_elems[0xf] = 0;
          local_438.data._M_elems[0x10] = 0;
          local_438.data._M_elems[0x11] = 0;
          local_438.data._M_elems[0x12] = 0;
          local_438.data._M_elems[0x13] = 0;
          local_438.data._M_elems[0x14] = 0;
          local_438.data._M_elems[0x15] = 0;
          local_438.data._M_elems[0x16] = 0;
          local_438.data._M_elems[0x17] = 0;
          local_438.data._M_elems[0x18] = 0;
          local_438.data._M_elems[0x19] = 0;
          local_438.data._M_elems._104_5_ = 0;
          local_438.data._M_elems[0x1b]._1_3_ = 0;
          local_438.exp = 0;
          local_438.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_438,local_3a8);
          if ((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar13 + 8U) != 2) &&
             (local_438.fpclass != cpp_dec_float_NaN)) {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar13),&local_438);
            SVar4 = P_FREE;
            if (-1 < iVar5) goto LAB_004f22bf;
          }
        }
        pnVar12 = (this->theLP->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_320 = (fpclass_type  [2])0x1c00000000;
        local_398._0_8_ = (_func_int **)0x0;
        local_398._8_8_ = 0;
        local_388 = (istream *)0x0;
        uStack_380._0_4_ = 0;
        uStack_380._4_4_ = ~MINIMIZE;
        local_378 = 0;
        acStack_370[0] = '\0';
        acStack_370[1] = '\0';
        acStack_370[2] = '\0';
        acStack_370[3] = '\0';
        acStack_370[4] = '\0';
        acStack_370[5] = '\0';
        acStack_370[6] = '\0';
        acStack_370[7] = '\0';
        acStack_370[8] = '\0';
        acStack_370[9] = '\0';
        acStack_370[10] = '\0';
        acStack_370[0xb] = '\0';
        acStack_370[0xc] = '\0';
        acStack_370[0xd] = '\0';
        acStack_370[0xe] = '\0';
        acStack_370[0xf] = '\0';
        acStack_370[0x10] = '\0';
        acStack_370[0x11] = '\0';
        acStack_370[0x12] = '\0';
        acStack_370[0x13] = '\0';
        acStack_370[0x14] = '\0';
        acStack_370[0x15] = '\0';
        acStack_370[0x16] = '\0';
        acStack_370[0x17] = '\0';
        acStack_370[0x18] = '\0';
        acStack_370[0x19] = '\0';
        acStack_370[0x1a] = '\0';
        acStack_370[0x1b] = '\0';
        acStack_370[0x1c] = '\0';
        acStack_370[0x1d] = '\0';
        acStack_370[0x1e] = '\0';
        acStack_370[0x1f] = '\0';
        acStack_370[0x20] = '\0';
        acStack_370[0x21] = '\0';
        acStack_370[0x22] = '\0';
        acStack_370[0x23] = '\0';
        acStack_370[0x24] = '\0';
        acStack_370[0x25] = '\0';
        acStack_370[0x26] = '\0';
        acStack_370[0x27] = '\0';
        acStack_370[0x28] = '\0';
        acStack_370[0x29] = '\0';
        acStack_370[0x2a] = '\0';
        acStack_370[0x2b] = '\0';
        acStack_370[0x2c] = '\0';
        acStack_370[0x2d] = '\0';
        acStack_370[0x2e] = '\0';
        acStack_370[0x2f] = '\0';
        acStack_370[0x30] = '\0';
        acStack_370[0x31] = '\0';
        acStack_370[0x32] = '\0';
        acStack_370[0x33] = '\0';
        acStack_370[0x34] = '\0';
        acStack_370[0x35] = '\0';
        acStack_370[0x36] = '\0';
        acStack_370[0x37] = '\0';
        acStack_370[0x38] = '\0';
        acStack_370[0x39] = '\0';
        acStack_370[0x3a] = '\0';
        acStack_370[0x3b] = '\0';
        acStack_370[0x3c] = '\0';
        acStack_370[0x3d] = '\0';
        acStack_370[0x3e] = '\0';
        acStack_370[0x3f] = '\0';
        acStack_370[0x40] = '\0';
        acStack_370[0x41] = '\0';
        acStack_370[0x42] = '\0';
        acStack_370[0x43] = '\0';
        acStack_370[0x44] = '\0';
        acStack_370[0x45] = '\0';
        acStack_370[0x46] = '\0';
        acStack_370[0x47] = '\0';
        acStack_370[0x48] = '\0';
        acStack_370[0x49] = '\0';
        acStack_370[0x4a] = '\0';
        acStack_370[0x4b] = '\0';
        acStack_370[0x4c] = '\0';
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_398,(double)CONCAT44(uStack_3b4,local_3b8))
        ;
        if (((*(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar13 + 8U) == 2) ||
            (local_320[0] == cpp_dec_float_NaN)) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)
                               ((long)(pnVar12->m_backend).data._M_elems + lVar13),
                               (cpp_dec_float<200U,_int,_void> *)local_398), 0 < iVar5)) {
          SVar4 = P_ON_LOWER;
        }
        else {
          SVar4 = P_ON_UPPER;
        }
      }
      else {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          ((cpp_dec_float<200U,_int,_void> *)
                           ((long)(pnVar12->m_backend).data._M_elems + lVar13),
                           (cpp_dec_float<200U,_int,_void> *)
                           ((long)(pnVar1->m_backend).data._M_elems + lVar13));
        if (iVar5 != 0) {
          pnVar12 = (this->theLP->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_004f20b6;
        }
        SVar4 = P_FIXED;
      }
LAB_004f22bf:
      local_490.colstat.data[lVar11] = SVar4;
      lVar11 = lVar11 + 1;
      pSVar8 = this->theLP;
      lVar13 = lVar13 + 0x80;
    } while (lVar11 < (pSVar8->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_398._0_8_ = &PTR__MPSInput_0069d4f8;
  local_398._8_8_ = local_398._8_8_ & 0xffffffff00000000;
  local_388 = local_440;
  uStack_380._0_4_ = 0;
  uStack_380._4_4_ = MINIMIZE;
  local_378 = local_378 & 0xffffffffffff0000;
  local_40._0_1_ = false;
  local_40._1_1_ = false;
  local_3c = 0;
  local_140 = '\0';
  local_270 = (char *)0x0;
  pcStack_268 = (char *)0x0;
  local_260 = (char *)0x0;
  pcStack_258 = (char *)0x0;
  local_250 = (char *)0x0;
  pcStack_248 = (char *)0x0;
  local_240 = '\0';
  bVar3 = MPSInput::readLine((MPSInput *)local_398);
  pNVar2 = local_498;
  if (((bVar3) && (local_270 != (char *)0x0)) && (iVar5 = strcmp(local_270,"NAME"), iVar5 == 0)) {
    while (bVar3 = MPSInput::readLine((MPSInput *)local_398), bVar3) {
      if ((local_270 != (char *)0x0) && (iVar5 = strcmp(local_270,"ENDATA"), iVar5 == 0)) {
        local_398._8_4_ = 8;
        break;
      }
      if (((pcStack_268 == (char *)0x0) || (local_260 == (char *)0x0)) ||
         (uVar6 = NameSet::number(local_4a0,local_260), (int)uVar6 < 0)) break;
      cVar9 = *pcStack_268;
      if (cVar9 == 'X') {
        if ((pcStack_258 == (char *)0x0) || (i = NameSet::number(local_450,pcStack_258), (int)i < 0)
           ) break;
        cVar9 = *pcStack_268;
        if (cVar9 != 'X') goto LAB_004f2570;
        if ((pcStack_268[1] == 'U') && (pcStack_268[2] == '\0')) {
          SVar4 = dualColStatus(this,uVar6);
          local_490.colstat.data[uVar6] = SVar4;
          TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)this->theLP,i);
          if (TVar7 == GREATER_EQUAL) {
            local_490.rowstat.data[i] = P_ON_LOWER;
          }
          else {
            TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)this->theLP,i);
            if (TVar7 == EQUAL) {
LAB_004f2564:
              local_490.rowstat.data[i] = P_FIXED;
            }
            else {
              local_490.rowstat.data[i] = P_ON_UPPER;
            }
          }
        }
        else {
          if ((pcStack_268[1] != 'L') || (pcStack_268[2] != '\0')) {
LAB_004f2650:
            MPSInput::syntaxError((MPSInput *)local_398);
            break;
          }
          SVar4 = dualColStatus(this,uVar6);
          local_490.colstat.data[uVar6] = SVar4;
          TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)this->theLP,i);
          if (TVar7 == LESS_EQUAL) {
            local_490.rowstat.data[i] = P_ON_UPPER;
          }
          else {
            TVar7 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)this->theLP,i);
            if (TVar7 == EQUAL) goto LAB_004f2564;
            local_490.rowstat.data[i] = P_ON_LOWER;
          }
        }
      }
      else {
LAB_004f2570:
        if (cVar9 == 'L') {
          if ((pcStack_268[1] != 'L') || (pcStack_268[2] != '\0')) goto LAB_004f2650;
          local_490.colstat.data[uVar6] = P_ON_LOWER;
        }
        else {
          if (((cVar9 != 'U') || (pcStack_268[1] != 'L')) || (pcStack_268[2] != '\0'))
          goto LAB_004f2650;
          local_490.colstat.data[uVar6] = P_ON_UPPER;
        }
      }
    }
  }
  if (local_378._0_1_ == false) {
    if (local_398._8_4_ == ENDATA) {
      if (this->thestatus != REGULAR) {
        this->thestatus = REGULAR;
      }
      (*this->_vptr_SPxBasisBase[5])(this,(DataKey *)&local_490);
    }
    else {
      MPSInput::syntaxError((MPSInput *)local_398);
    }
  }
  if (pNVar2 == (NameSet *)0x0) {
    NameSet::~NameSet(local_4b8);
    free(local_4b8);
    local_4b8 = (NameSet *)0x0;
  }
  if (local_448 == (NameSet *)0x0) {
    NameSet::~NameSet(local_4b0);
    free(local_4b0);
    local_4b0 = (NameSet *)0x0;
  }
  bVar3 = local_378._0_1_;
  if (local_490.colstat.data != (Status *)0x0) {
    free(local_490.colstat.data);
    local_490.colstat.data = (Status *)0x0;
  }
  if (local_490.rowstat.data != (Status *)0x0) {
    free(local_490.rowstat.data);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool SPxBasisBase<R>::readBasis(
   std::istream&  is,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   assert(theLP != nullptr);

   /* prepare names */
   const NameSet* rNames = rowNames;
   const NameSet* cNames = colNames;

   NameSet* p_colNames = nullptr;
   NameSet* p_rowNames = nullptr;

   if(colNames == nullptr)
   {
      int nCols = theLP->nCols();
      std::stringstream name;

      spx_alloc(p_colNames);
      p_colNames = new(p_colNames) NameSet();
      p_colNames->reMax(nCols);

      for(int j = 0; j < nCols; ++j)
      {
         name << "x" << j;
         DataKey key = theLP->colId(j);
         p_colNames->add(key, name.str().c_str());
      }

      cNames = p_colNames;
   }

   if(rNames == nullptr)
   {
      int nRows = theLP->nRows();
      std::stringstream name;

      spx_alloc(p_rowNames);
      p_rowNames = new(p_rowNames) NameSet();
      p_rowNames->reMax(nRows);

      for(int i = 0; i < nRows; ++i)
      {
         name << "C" << i;
         DataKey key = theLP->rowId(i);
         p_rowNames->add(key, name.str().c_str());
      }

      rNames = p_rowNames;
   }

   /* load default basis if necessary */
   if(status() == NO_PROBLEM)
      load(theLP, false);

   /* initialize with standard settings */
   Desc l_desc(thedesc);

   for(int i = 0; i < theLP->nRows(); i++)
      l_desc.rowstat[i] = dualRowStatus(i);

   for(int i = 0; i < theLP->nCols(); i++)
   {
      if(theLP->SPxLPBase<R>::lower(i) == theLP->SPxLPBase<R>::upper(i))
         l_desc.colstat[i] = Desc::P_FIXED;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity)
              && theLP->SPxLPBase<R>::upper(i) >= R(infinity))
         l_desc.colstat[i] = Desc::P_FREE;
      else if(theLP->SPxLPBase<R>::lower(i) <= R(-infinity))
         l_desc.colstat[i] = Desc::P_ON_UPPER;
      else
         l_desc.colstat[i] = Desc::P_ON_LOWER;
   }

   MPSInput mps(is);

   if(mps.readLine() && (mps.field0() != nullptr) && !strcmp(mps.field0(), "NAME"))
   {
      while(mps.readLine())
      {
         int c = -1;
         int r = -1;

         if((mps.field0() != nullptr) && !strcmp(mps.field0(), "ENDATA"))
         {
            mps.setSection(MPSInput::ENDATA);
            break;
         }

         if((mps.field1() == nullptr) || (mps.field2() == nullptr))
            break;

         if((c = cNames->number(mps.field2())) < 0)
            break;

         if(*mps.field1() == 'X')
            if(mps.field3() == nullptr || (r = rNames->number(mps.field3())) < 0)
               break;

         if(!strcmp(mps.field1(), "XU"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::GREATER_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "XL"))
         {
            l_desc.colstat[c] = dualColStatus(c);

            if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::LESS_EQUAL)
               l_desc.rowstat[r] = Desc::P_ON_UPPER;
            else if(theLP->LPRowSetBase<R>::type(r) == LPRowBase<R>::EQUAL)
               l_desc.rowstat[r] = Desc::P_FIXED;
            else
               l_desc.rowstat[r] = Desc::P_ON_LOWER;
         }
         else if(!strcmp(mps.field1(), "UL"))
         {
            l_desc.colstat[c] = Desc::P_ON_UPPER;
         }
         else if(!strcmp(mps.field1(), "LL"))
         {
            l_desc.colstat[c] = Desc::P_ON_LOWER;
         }
         else
         {
            mps.syntaxError();
            break;
         }
      }
   }

   if(!mps.hasError())
   {
      if(mps.section() == MPSInput::ENDATA)
      {
         // force basis to be different from NO_PROBLEM
         // otherwise the basis will be overwritten at later stages.
         setStatus(REGULAR);
         loadDesc(l_desc);
      }
      else
         mps.syntaxError();
   }

   if(rowNames == nullptr)
   {
      p_rowNames->~NameSet();
      spx_free(p_rowNames);
   }

   if(colNames == nullptr)
   {
      p_colNames->~NameSet();
      spx_free(p_colNames);
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());
#endif

   return !mps.hasError();
}